

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O0

bool helics::isDependencyCommand(ActionMessage *command)

{
  action_t aVar1;
  ActionMessage *in_RDI;
  bool local_1;
  
  aVar1 = ActionMessage::action(in_RDI);
  if ((((uint)(aVar1 + ~(cmd_remove_publication|cmd_disconnect)) < 2) ||
      ((uint)(aVar1 + ~(cmd_add_dependency|cmd_disconnect)) < 2)) ||
     (aVar1 == cmd_add_interdependency || aVar1 == cmd_remove_interdependency)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool isDependencyCommand(const ActionMessage& command) noexcept
{
    switch (command.action()) {
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
            return true;
        default:
            return false;
    }
}